

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Peeps.cpp
# Opt level: O3

Instr * Peeps::PeepBranch(BranchInstr *branchInstr,bool *peepedRef)

{
  char cVar1;
  IRKind IVar2;
  OpCode OVar3;
  Kind KVar4;
  Func *pFVar5;
  long *plVar6;
  code *pcVar7;
  bool bVar8;
  IRKind IVar9;
  OpndKind OVar10;
  byte bVar11;
  OpCode opcode;
  undefined4 *puVar12;
  LabelInstr *instr;
  LabelInstr *pLVar13;
  BranchInstr *this;
  LabelInstr *pLVar14;
  JITTimeFunctionBody *this_00;
  RegOpnd *this_01;
  StackSym *pSVar15;
  ByteCodeUsesInstr *this_02;
  Instr *instr_00;
  Opnd *pOVar16;
  MultiBranchInstr *pMVar17;
  long lVar18;
  LabelInstr *pLVar19;
  uint uVar20;
  ulong uVar21;
  long lVar22;
  BranchDictionary *branchDictionary;
  int iVar23;
  Instr *instrTmp;
  long lVar24;
  long *plVar25;
  bool *peepedRef_local;
  
  puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
LAB_0061be03:
  do {
    if (peepedRef != (bool *)0x0) {
      *peepedRef = false;
    }
    pLVar19 = branchInstr->m_branchTarget;
    OVar3 = (branchInstr->super_Instr).m_opcode;
    if (OVar3 < ADD) {
      if ((OVar3 == MultiBr) || (OVar3 == Br)) goto LAB_0061be36;
    }
    else {
      bVar8 = LowererMD::IsUnconditionalBranch(&branchInstr->super_Instr);
      if (bVar8) {
LAB_0061be36:
        RemoveDeadBlock((branchInstr->super_Instr).m_next,(bool *)0x0);
      }
    }
    instr = (LabelInstr *)IR::Instr::GetNextRealInstrOrLabel(&branchInstr->super_Instr);
    if ((instr == (LabelInstr *)0x0) ||
       ((IVar9 = (instr->super_Instr).m_kind, IVar9 != InstrKindProfiledLabel &&
        (IVar9 != InstrKindLabel)))) {
      OVar3 = (branchInstr->super_Instr).m_opcode;
      if (OVar3 < ADD) {
        if ((OVar3 != Br) && (OVar3 != MultiBr)) goto LAB_0061be99;
      }
      else {
        bVar8 = LowererMD::IsUnconditionalBranch(&branchInstr->super_Instr);
        if (!bVar8) {
LAB_0061be99:
          if (instr == (LabelInstr *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar12 = 1;
            bVar8 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Peeps.cpp"
                               ,0x251,"(instrNext)","instrNext");
            if (!bVar8) goto LAB_0061c8fb;
            *puVar12 = 0;
          }
          if ((instr->super_Instr).m_kind == InstrKindBranch) {
            OVar3 = (instr->super_Instr).m_opcode;
            if (OVar3 < ADD) {
              if ((OVar3 == Br) || (OVar3 == MultiBr)) goto LAB_0061bf5d;
            }
            else {
              bVar8 = LowererMD::IsUnconditionalBranch((Instr *)instr);
              if (bVar8) {
                if ((instr->super_Instr).m_kind != InstrKindBranch) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  *puVar12 = 1;
                  bVar8 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                                     ,0x5e,"(this->IsBranchInstr())","Bad call to AsBranchInstr()");
                  if (!bVar8) goto LAB_0061c8fb;
                  *puVar12 = 0;
                }
LAB_0061bf5d:
                pLVar13 = (LabelInstr *)IR::Instr::GetNextRealInstrOrLabel((Instr *)instr);
                if (pLVar19 == pLVar13) {
                  if ((instr->super_Instr).m_kind != InstrKindBranch) {
                    AssertCount = AssertCount + 1;
                    Js::Throw::LogAssert();
                    *puVar12 = 1;
                    bVar8 = Js::Throw::ReportAssert
                                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                                       ,0x5e,"(this->IsBranchInstr())","Bad call to AsBranchInstr()"
                                      );
                    if (!bVar8) goto LAB_0061c8fb;
                    *puVar12 = 0;
                  }
                  cVar1 = *(char *)((long)&(instr->labelRefs).
                                           super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>
                                           .
                                           super_SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>
                                           .super_SListNodeBase<Memory::ArenaAllocator>.next + 1);
                  if ((instr->labelRefs).
                      super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.allocator !=
                      (Type)0x0) {
                    if (cVar1 != '\0') {
                      AssertCount = AssertCount + 1;
                      Js::Throw::LogAssert();
                      *puVar12 = 1;
                      bVar8 = Js::Throw::ReportAssert
                                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                                         ,0x209,"(!m_isMultiBranch)","!m_isMultiBranch");
                      if (!bVar8) goto LAB_0061c8fb;
                      *puVar12 = 0;
                    }
                    this = IR::Instr::AsBranchInstr((Instr *)instr);
                    if ((branchInstr->super_Instr).m_opcode < ADD) {
                      IR::BranchInstr::Invert(branchInstr);
                    }
                    else {
                      LowererMD::InvertBranch(branchInstr);
                    }
                    pLVar19 = this->m_branchTarget;
                    IR::BranchInstr::SetTarget(branchInstr,pLVar19);
                    if (((SListCounted<IR::BranchInstr_*,_Memory::ArenaAllocator> *)
                         (pLVar19->labelRefs).
                         super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
                         super_SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
                         super_SListNodeBase<Memory::ArenaAllocator>.next == &pLVar19->labelRefs) &&
                       ((pLVar19->field_0x78 & 4) == 0)) {
                      PeepUnreachableLabel(pLVar19,false,(bool *)0x0);
                    }
                    IR::Instr::Remove(&this->super_Instr);
                    goto LAB_0061be03;
                  }
                  if (cVar1 == '\0') {
                    AssertCount = AssertCount + 1;
                    Js::Throw::LogAssert();
                    *puVar12 = 1;
                    bVar8 = Js::Throw::ReportAssert
                                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                                       ,0x20e,"(m_isMultiBranch)","m_isMultiBranch");
                    if (!bVar8) goto LAB_0061c8fb;
                    *puVar12 = 0;
                  }
                }
              }
            }
          }
        }
      }
LAB_0061c6f3:
      if (branchInstr->m_branchTarget == (LabelInstr *)0x0) {
        if (branchInstr->m_isMultiBranch == false) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar12 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                             ,0x20e,"(m_isMultiBranch)","m_isMultiBranch");
          if (!bVar8) goto LAB_0061c8fb;
          *puVar12 = 0;
        }
        pMVar17 = IR::BranchInstr::AsMultiBrInstr(branchInstr);
        plVar6 = (long *)pMVar17->m_branchTargets;
        if (plVar6 != (long *)0x0) {
          KVar4 = pMVar17->m_kind;
          if ((KVar4 == IntJumpTable) || (KVar4 == SingleCharStrJumpTable)) {
            plVar25 = plVar6 + 1;
            lVar24 = pMVar17->m_baseCaseValue;
            if (lVar24 <= pMVar17->m_lastCaseValue) {
              lVar18 = *plVar6;
              do {
                lVar22 = lVar18 + pMVar17->m_baseCaseValue * -8;
                pLVar19 = RetargetBrToBr(branchInstr,*(LabelInstr **)(lVar22 + lVar24 * 8));
                *(LabelInstr **)(lVar22 + lVar24 * 8) = pLVar19;
                lVar24 = lVar24 + 1;
              } while (lVar24 <= pMVar17->m_lastCaseValue);
            }
          }
          else if (KVar4 == StrDictionary) {
            plVar25 = plVar6 + 7;
            uVar20 = *(uint *)((long)plVar6 + 0x1c);
            if (uVar20 != 0) {
              uVar21 = 0;
              do {
                iVar23 = *(int *)(*plVar6 + uVar21 * 4);
                if (iVar23 != -1) {
                  do {
                    lVar24 = plVar6[1];
                    lVar18 = (long)iVar23;
                    iVar23 = *(int *)(lVar24 + 8 + lVar18 * 0x18);
                    pLVar19 = RetargetBrToBr(branchInstr,*(LabelInstr **)(lVar24 + lVar18 * 0x18));
                    *(LabelInstr **)(lVar24 + lVar18 * 0x18) = pLVar19;
                  } while (iVar23 != -1);
                  uVar20 = *(uint *)((long)plVar6 + 0x1c);
                }
                uVar21 = uVar21 + 1;
              } while (uVar21 < uVar20);
            }
          }
          else {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar12 = 1;
            bVar8 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                               ,0x435,"(false)","false");
            if (!bVar8) {
LAB_0061c8fb:
              pcVar7 = (code *)invalidInstructionException();
              (*pcVar7)();
            }
            *puVar12 = 0;
            plVar25 = (long *)0x0;
          }
          pLVar19 = RetargetBrToBr(branchInstr,(LabelInstr *)*plVar25);
          *plVar25 = (long)pLVar19;
        }
      }
      else {
        if (branchInstr->m_isMultiBranch != false) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar12 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                             ,0x209,"(!m_isMultiBranch)","!m_isMultiBranch");
          if (!bVar8) goto LAB_0061c8fb;
          *puVar12 = 0;
        }
        RetargetBrToBr(branchInstr,pLVar19);
      }
      return (branchInstr->super_Instr).m_next;
    }
    pLVar13 = instr;
    if (instr != pLVar19) {
      do {
        IVar9 = (pLVar13->super_Instr).m_kind;
        if ((IVar9 != InstrKindProfiledLabel) && (IVar9 != InstrKindLabel)) goto LAB_0061c09c;
        pLVar13 = (LabelInstr *)IR::Instr::GetNextRealInstrOrLabel(&pLVar13->super_Instr);
      } while (pLVar13 != pLVar19);
      IVar9 = (pLVar13->super_Instr).m_kind;
    }
LAB_0061c09c:
    if ((IVar9 == InstrKindProfiledLabel) || (pLVar14 = pLVar13, IVar9 == InstrKindLabel)) {
      if (instr == pLVar13) {
        pLVar14 = (LabelInstr *)0x0;
      }
      else {
        IVar2 = (instr->super_Instr).m_kind;
        if ((IVar2 != InstrKindLabel) && (IVar2 != InstrKindProfiledLabel)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar12 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                             ,0x7a,"(this->IsLabelInstr())","Bad call to AsLabelInstr()");
          if (!bVar8) goto LAB_0061c8fb;
          *puVar12 = 0;
          IVar9 = (pLVar13->super_Instr).m_kind;
        }
        bVar11 = instr->field_0x78;
        if ((IVar9 != InstrKindLabel) && (IVar9 != InstrKindProfiledLabel)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar12 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                             ,0x7a,"(this->IsLabelInstr())","Bad call to AsLabelInstr()");
          if (!bVar8) goto LAB_0061c8fb;
          *puVar12 = 0;
        }
        if (((bVar11 ^ pLVar13->field_0x78) & 2) != 0) {
          IVar9 = (instr->super_Instr).m_kind;
          if ((IVar9 != InstrKindLabel) && (IVar9 != InstrKindProfiledLabel)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar12 = 1;
            bVar8 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                               ,0x7a,"(this->IsLabelInstr())","Bad call to AsLabelInstr()");
            if (!bVar8) goto LAB_0061c8fb;
            *puVar12 = 0;
          }
          instr->field_0x78 = instr->field_0x78 | 0x20;
        }
        IVar9 = (pLVar13->super_Instr).m_kind;
        if ((IVar9 != InstrKindLabel) && (IVar9 != InstrKindProfiledLabel)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar12 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                             ,0x7a,"(this->IsLabelInstr())","Bad call to AsLabelInstr()");
          if (!bVar8) goto LAB_0061c8fb;
          *puVar12 = 0;
        }
        bVar11 = pLVar13->field_0x78;
        IVar9 = (instr->super_Instr).m_kind;
        if ((IVar9 != InstrKindLabel) && (IVar9 != InstrKindProfiledLabel)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar12 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                             ,0x7a,"(this->IsLabelInstr())","Bad call to AsLabelInstr()");
          if (!bVar8) goto LAB_0061c8fb;
          *puVar12 = 0;
        }
        instr->field_0x78 = instr->field_0x78 & 0xfd | bVar11 & 2;
        pLVar14 = instr;
        instr = pLVar13;
      }
    }
    if (pLVar19 != instr) goto LAB_0061c6f3;
    if ((branchInstr->super_Instr).m_opcode < ADD) {
      bVar8 = IR::Instr::HasAnyImplicitCalls(&branchInstr->super_Instr);
      if (bVar8) {
        this_00 = JITTimeWorkItem::GetJITFunctionBody
                            (((branchInstr->super_Instr).m_func)->m_workItem);
        bVar8 = JITTimeFunctionBody::IsAsmJsMode(this_00);
        if (bVar8) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar12 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Peeps.cpp"
                             ,0x1ed,"(!branchInstr->m_func->GetJITFunctionBody()->IsAsmJsMode())",
                             "!branchInstr->m_func->GetJITFunctionBody()->IsAsmJsMode()");
          if (!bVar8) goto LAB_0061c8fb;
          *puVar12 = 0;
        }
        OVar3 = (branchInstr->super_Instr).m_opcode;
        opcode = DeadBrEqual;
        uVar20 = OVar3 - 0x18e;
        if (uVar20 < 0xe) {
          if ((0x3c0fU >> (uVar20 & 0x1f) & 1) == 0) {
            if ((0xc0U >> (uVar20 & 0x1f) & 1) == 0) {
              if ((0x300U >> (uVar20 & 0x1f) & 1) == 0) goto LAB_0061c34f;
LAB_0061c382:
              opcode = DeadBrSrEqual;
            }
          }
          else {
LAB_0061c446:
            opcode = DeadBrRelational;
          }
        }
        else {
LAB_0061c34f:
          uVar20 = (uint)OVar3;
          if (OVar3 < 0x16) {
            if ((0xf0000U >> (OVar3 & 0x1f) & 1) != 0) goto LAB_0061c446;
            if ((0x3000U >> (uVar20 & 0x1f) & 1) != 0) goto LAB_0061c44a;
            if ((0x300000U >> (uVar20 & 0x1f) & 1) != 0) goto LAB_0061c382;
          }
          if (uVar20 - 0x102 < 2) {
            opcode = DeadBrOnHasProperty;
          }
          else {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar12 = 1;
            bVar8 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Peeps.cpp"
                               ,0x216,"((0))","UNREACHED");
            if (!bVar8) goto LAB_0061c8fb;
            *puVar12 = 0;
            opcode = Nop;
          }
        }
LAB_0061c44a:
        instr_00 = IR::Instr::New(opcode,(branchInstr->super_Instr).m_func);
        pOVar16 = (branchInstr->super_Instr).m_src1;
        if (instr_00->m_src1 != (Opnd *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar12 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                             ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
          if (!bVar8) goto LAB_0061c8fb;
          *puVar12 = 0;
        }
        pFVar5 = instr_00->m_func;
        if (pOVar16->isDeleted == true) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar12 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x14,"(!isDeleted)","Using deleted operand");
          if (!bVar8) goto LAB_0061c8fb;
          *puVar12 = 0;
        }
        bVar11 = pOVar16->field_0xb;
        if ((bVar11 & 2) != 0) {
          pOVar16 = IR::Opnd::Copy(pOVar16,pFVar5);
          bVar11 = pOVar16->field_0xb;
        }
        pOVar16->field_0xb = bVar11 | 2;
        instr_00->m_src1 = pOVar16;
        pOVar16 = (branchInstr->super_Instr).m_src2;
        if (instr_00->m_src2 != (Opnd *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar12 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                             ,0x18b,"(this->m_src2 == __null)","Trying to overwrite existing src.");
          if (!bVar8) goto LAB_0061c8fb;
          *puVar12 = 0;
        }
        pFVar5 = instr_00->m_func;
        if (pOVar16->isDeleted == true) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar12 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x14,"(!isDeleted)","Using deleted operand");
          if (!bVar8) goto LAB_0061c8fb;
          *puVar12 = 0;
        }
        bVar11 = pOVar16->field_0xb;
        if ((bVar11 & 2) != 0) {
          pOVar16 = IR::Opnd::Copy(pOVar16,pFVar5);
          bVar11 = pOVar16->field_0xb;
        }
        pOVar16->field_0xb = bVar11 | 2;
        instr_00->m_src2 = pOVar16;
        IR::Instr::InsertBefore(&branchInstr->super_Instr,instr_00);
        IR::Instr::SetByteCodeOffset(instr_00,&branchInstr->super_Instr);
      }
      else {
        pOVar16 = (branchInstr->super_Instr).m_src1;
        if ((pOVar16 != (Opnd *)0x0) && ((branchInstr->super_Instr).m_src2 == (Opnd *)0x0)) {
          OVar10 = IR::Opnd::GetKind(pOVar16);
          if (OVar10 != OpndKindReg) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar12 = 1;
            bVar8 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Peeps.cpp"
                               ,0x222,"(branchInstr->GetSrc1()->IsRegOpnd())",
                               "branchInstr->GetSrc1()->IsRegOpnd()");
            if (!bVar8) goto LAB_0061c8fb;
            *puVar12 = 0;
          }
          this_01 = IR::Opnd::AsRegOpnd((branchInstr->super_Instr).m_src1);
          pSVar15 = IR::Opnd::GetStackSym(&this_01->super_Opnd);
          if (((pSVar15->field_0x19 & 0x20) != 0) && (((this_01->super_Opnd).field_0xb & 8) == 0)) {
            this_02 = IR::ByteCodeUsesInstr::New(&branchInstr->super_Instr);
            IR::ByteCodeUsesInstr::Set(this_02,&this_01->super_Opnd);
            IR::Instr::InsertBefore(&branchInstr->super_Instr,&this_02->super_Instr);
          }
        }
      }
    }
    if (peepedRef != (bool *)0x0) {
      *peepedRef = true;
    }
    IR::Instr::Remove(&branchInstr->super_Instr);
    if (((SListCounted<IR::BranchInstr_*,_Memory::ArenaAllocator> *)
         (pLVar19->labelRefs).super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
         super_SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
         super_SListNodeBase<Memory::ArenaAllocator>.next == &pLVar19->labelRefs) &&
       ((pLVar19->field_0x78 & 4) == 0)) {
      pLVar19 = (LabelInstr *)PeepUnreachableLabel(pLVar19,false,(bool *)0x0);
    }
    branchInstr = (BranchInstr *)IR::Instr::GetPrevRealInstrOrLabel(&pLVar19->super_Instr);
    peepedRef = (bool *)0x0;
    if ((branchInstr->super_Instr).m_kind != InstrKindBranch) {
      if (pLVar14 == (LabelInstr *)0x0) {
        return &pLVar19->super_Instr;
      }
      return &pLVar14->super_Instr;
    }
  } while( true );
}

Assistant:

IR::Instr *
Peeps::PeepBranch(IR::BranchInstr *branchInstr, bool *const peepedRef)
{
    if(peepedRef)
    {
        *peepedRef = false;
    }

    IR::LabelInstr *targetInstr = branchInstr->GetTarget();
    IR::Instr *instrNext;

    if (branchInstr->IsUnconditional())
    {
        // Cleanup unreachable code after unconditional branch
        instrNext = RemoveDeadBlock(branchInstr->m_next);
    }

    instrNext = branchInstr->GetNextRealInstrOrLabel();

    if (instrNext != NULL && instrNext->IsLabelInstr())
    {
        //
        // Remove branch-to-next
        //
        IR::Instr * instrSkip = instrNext;
        while (instrSkip != targetInstr && instrSkip->IsLabelInstr())
        {
            // Skip adjacent labels
            instrSkip = instrSkip->GetNextRealInstrOrLabel();
        }
        if (instrSkip->IsLabelInstr())
        {
            if (instrNext == instrSkip)
            {
                instrSkip = nullptr;
            }
            else
            {
                IR::Instr *instrTmp = instrSkip;

                // Ignore assertion error for cases where we insert an "airlock" helper block
                // for a Branch instruction's helper path that:
                //  1) ends up being empty
                //  2) comes after a helper block from another instruction
                //  3) is followed by a non-helper block
                //
                // Propagating the "isOpHelper" flag can potentially make this block a non-helper,
                // and that makes this block only reachable through helper blocks, thus failing the assert 
#if DBG
                if (instrNext->AsLabelInstr()->isOpHelper != instrSkip->AsLabelInstr()->isOpHelper)
                {
                    instrNext->AsLabelInstr()->m_noHelperAssert = true;
                }
#endif
                instrNext->AsLabelInstr()->isOpHelper = instrSkip->AsLabelInstr()->isOpHelper;
                instrSkip = instrNext;
                instrNext = instrTmp;
            }
        }
        if (targetInstr == instrNext)
        {
            if (!branchInstr->IsLowered())
            {
                if (branchInstr->HasAnyImplicitCalls())
                {
                    Assert(!branchInstr->m_func->GetJITFunctionBody()->IsAsmJsMode());
                    // if (x > y) might trigger a call to valueof() or something for x and y.
                    // We can't just delete them.
                    Js::OpCode newOpcode;
                    switch(branchInstr->m_opcode)
                    {
                    case Js::OpCode::BrEq_A:
                    case Js::OpCode::BrNeq_A:
                    case Js::OpCode::BrNotEq_A:
                    case Js::OpCode::BrNotNeq_A:
                        newOpcode = Js::OpCode::DeadBrEqual;
                        break;

                    case Js::OpCode::BrSrEq_A:
                    case Js::OpCode::BrSrNeq_A:
                    case Js::OpCode::BrSrNotEq_A:
                    case Js::OpCode::BrSrNotNeq_A:
                        newOpcode = Js::OpCode::DeadBrSrEqual;
                        break;

                    case Js::OpCode::BrGe_A:
                    case Js::OpCode::BrGt_A:
                    case Js::OpCode::BrLe_A:
                    case Js::OpCode::BrLt_A:
                    case Js::OpCode::BrNotGe_A:
                    case Js::OpCode::BrNotGt_A:
                    case Js::OpCode::BrNotLe_A:
                    case Js::OpCode::BrNotLt_A:
                    case Js::OpCode::BrUnGe_A:
                    case Js::OpCode::BrUnGt_A:
                    case Js::OpCode::BrUnLe_A:
                    case Js::OpCode::BrUnLt_A:
                        newOpcode = Js::OpCode::DeadBrRelational;
                        break;

                    case Js::OpCode::BrOnHasProperty:
                    case Js::OpCode::BrOnNoProperty:
                        newOpcode = Js::OpCode::DeadBrOnHasProperty;
                        break;

                    default:
                        Assert(UNREACHED);
                        newOpcode = Js::OpCode::Nop;
                    }
                    IR::Instr *newInstr = IR::Instr::New(newOpcode, branchInstr->m_func);
                    newInstr->SetSrc1(branchInstr->GetSrc1());
                    newInstr->SetSrc2(branchInstr->GetSrc2());
                    branchInstr->InsertBefore(newInstr);
                    newInstr->SetByteCodeOffset(branchInstr);
                }
                else if (branchInstr->GetSrc1() && !branchInstr->GetSrc2())
                {
                    // We only have cases with one src
                    Assert(branchInstr->GetSrc1()->IsRegOpnd());

                    IR::RegOpnd *regSrc = branchInstr->GetSrc1()->AsRegOpnd();
                    StackSym *symSrc = regSrc->GetStackSym();

                    if (symSrc->HasByteCodeRegSlot() && !regSrc->GetIsJITOptimizedReg())
                    {
                        // No side-effects to worry about, but need to insert bytecodeUse.
                        IR::ByteCodeUsesInstr *byteCodeUsesInstr = IR::ByteCodeUsesInstr::New(branchInstr);
                        byteCodeUsesInstr->Set(regSrc);
                        branchInstr->InsertBefore(byteCodeUsesInstr);
                    }
                }
            }
            // Note: if branch is conditional, we have a dead test/cmp left behind...
            if(peepedRef)
            {
                *peepedRef = true;
            }
            branchInstr->Remove();
            if (targetInstr->IsUnreferenced())
            {
                // We may have exposed an unreachable label by deleting the branch
                instrNext = Peeps::PeepUnreachableLabel(targetInstr, false);
            }
            else
            {
                instrNext = targetInstr;
            }
            IR::Instr *instrPrev = instrNext->GetPrevRealInstrOrLabel();
            if (instrPrev->IsBranchInstr())
            {
                // The branch removal could have exposed a branch to next opportunity.
                return Peeps::PeepBranch(instrPrev->AsBranchInstr());
            }
            if (instrSkip)
            {
                return instrSkip;
            }
            else
            {
                return instrNext;
            }
        }
    }
    else if (branchInstr->IsConditional())
    {
        AnalysisAssert(instrNext);
        if (instrNext->IsBranchInstr()
            && instrNext->AsBranchInstr()->IsUnconditional()
            && targetInstr == instrNext->AsBranchInstr()->GetNextRealInstrOrLabel()
            && !instrNext->AsBranchInstr()->IsMultiBranch())
        {
            //
            // Invert condBranch/uncondBranch/label:
            //
            //      JCC L1                   JinvCC L3
            //      JMP L3       =>
            //      L1:
            IR::BranchInstr *uncondBranch = instrNext->AsBranchInstr();

            if (branchInstr->IsLowered())
            {
                LowererMD::InvertBranch(branchInstr);
            }
            else
            {
                branchInstr->Invert();
            }

            targetInstr = uncondBranch->GetTarget();
            branchInstr->SetTarget(targetInstr);
            if (targetInstr->IsUnreferenced())
            {
                Peeps::PeepUnreachableLabel(targetInstr, false);
            }

            uncondBranch->Remove();

            return PeepBranch(branchInstr, peepedRef);
        }
    }

    if(branchInstr->IsMultiBranch())
    {
        IR::MultiBranchInstr * multiBranchInstr = branchInstr->AsMultiBrInstr();

        multiBranchInstr->UpdateMultiBrLabels([=](IR::LabelInstr * targetInstr) -> IR::LabelInstr *
        {
            IR::LabelInstr * labelInstr = RetargetBrToBr(branchInstr, targetInstr);
            return labelInstr;
        });
    }
    else
    {
        RetargetBrToBr(branchInstr, targetInstr);
    }

    return branchInstr->m_next;
}